

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsIntToNumber(int intValue,JsValueRef *asValue)

{
  anon_class_16_2_4b51a5ba fn;
  bool bVar1;
  JsValueRef *local_18;
  JsValueRef *asValue_local;
  int intValue_local;
  
  if (asValue == (JsValueRef *)0x0) {
    asValue_local._4_4_ = JsErrorNullArgument;
  }
  else {
    local_18 = asValue;
    asValue_local._0_4_ = intValue;
    bVar1 = Js::JavascriptNumber::TryToVarFast(intValue,asValue);
    if (bVar1) {
      asValue_local._4_4_ = JsNoError;
    }
    else {
      fn.intValue = (int *)&asValue_local;
      fn.asValue = &local_18;
      asValue_local._4_4_ = ContextAPINoScriptWrapper<JsIntToNumber::__0>(fn,false,false);
    }
  }
  return asValue_local._4_4_;
}

Assistant:

CHAKRA_API JsIntToNumber(_In_ int intValue, _Out_ JsValueRef *asValue)
{
    PARAM_NOT_NULL(asValue);
    //If number is not heap allocated then we don't need to record/track the creation for time-travel
    if (Js::JavascriptNumber::TryToVarFast(intValue, asValue))
    {
        return JsNoError;
    }

    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
#if !INT32VAR
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateInteger, intValue);
#endif

        *asValue = Js::JavascriptNumber::ToVar(intValue, scriptContext);

#if !INT32VAR
        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, asValue);
#endif

        return JsNoError;
    });
}